

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadlib.c
# Opt level: O0

void createsearcherstable(lua_State *L)

{
  int local_14;
  int i;
  lua_State *L_local;
  
  lua_createtable(L,4,0);
  for (local_14 = 0; createsearcherstable::searchers[local_14] != (lua_CFunction)0x0;
      local_14 = local_14 + 1) {
    lua_pushvalue(L,-2);
    lua_pushcclosure(L,createsearcherstable::searchers[local_14],1);
    lua_rawseti(L,-2,(long)(local_14 + 1));
  }
  lua_setfield(L,-2,"searchers");
  return;
}

Assistant:

static void createsearcherstable(lua_State *L) {
    static const lua_CFunction searchers[] =
            {searcher_preload, searcher_Lua, searcher_C, searcher_Croot, NULL};
    int i;
    /* create 'searchers' table */
    lua_createtable(L, sizeof(searchers) / sizeof(searchers[0]) - 1, 0);
    /* fill it with predefined searchers */
    for (i = 0; searchers[i] != NULL; i++) {
        lua_pushvalue(L, -2);  /* set 'package' as upvalue for all searchers */
        lua_pushcclosure(L, searchers[i], 1);
        lua_rawseti(L, -2, i + 1);
    }
#if defined(LUA_COMPAT_LOADERS)
    lua_pushvalue(L, -1);  /* make a copy of 'searchers' table */
    lua_setfield(L, -3, "loaders");  /* put it in field 'loaders' */
#endif
    lua_setfield(L, -2, "searchers");  /* put it in field 'searchers' */
}